

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa_asn1.cc
# Opt level: O1

DSA_SIG * DSA_SIG_parse(CBS *cbs)

{
  int iVar1;
  DSA_SIG *a;
  CBS child;
  CBS local_20;
  
  a = DSA_SIG_new();
  if (a != (DSA_SIG *)0x0) {
    iVar1 = CBS_get_asn1(cbs,&local_20,0x20000010);
    if ((((iVar1 != 0) && (iVar1 = parse_integer(&local_20,(BIGNUM **)a), iVar1 != 0)) &&
        (iVar1 = parse_integer(&local_20,(BIGNUM **)&a->s), iVar1 != 0)) && (local_20.len == 0)) {
      return (DSA_SIG *)a;
    }
    ERR_put_error(10,0,0x69,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa_asn1.cc"
                  ,0x77);
    DSA_SIG_free(a);
  }
  return (DSA_SIG *)0x0;
}

Assistant:

DSA_SIG *DSA_SIG_parse(CBS *cbs) {
  DSA_SIG *ret = DSA_SIG_new();
  if (ret == NULL) {
    return NULL;
  }
  CBS child;
  if (!CBS_get_asn1(cbs, &child, CBS_ASN1_SEQUENCE) ||
      !parse_integer(&child, &ret->r) ||
      !parse_integer(&child, &ret->s) ||
      CBS_len(&child) != 0) {
    OPENSSL_PUT_ERROR(DSA, DSA_R_DECODE_ERROR);
    DSA_SIG_free(ret);
    return NULL;
  }
  return ret;
}